

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

String * __thiscall asl::Socket_::readLine(String *__return_storage_ptr__,Socket_ *this)

{
  int iVar1;
  uint uVar2;
  int n;
  char local_19;
  Socket_ *pSStack_18;
  char c;
  Socket_ *this_local;
  String *s;
  
  pSStack_18 = this;
  this_local = (Socket_ *)__return_storage_ptr__;
  asl::String::String(__return_storage_ptr__);
  iVar1 = (*(this->super_SmartObject_)._vptr_SmartObject_[0xc])();
  if ((0 < iVar1) ||
     (uVar2 = (*(this->super_SmartObject_)._vptr_SmartObject_[0xf])(0x404e000000000000),
     (uVar2 & 1) != 0)) {
    while( true ) {
      iVar1 = (*(this->super_SmartObject_)._vptr_SmartObject_[0xd])(this,&local_19,1);
      if (iVar1 < 1) {
        return __return_storage_ptr__;
      }
      if (local_19 == '\n') {
        return __return_storage_ptr__;
      }
      if (this->_error != 0) {
        return __return_storage_ptr__;
      }
      iVar1 = asl::String::length(__return_storage_ptr__);
      if (16000 < iVar1) break;
      asl::String::operator+=(__return_storage_ptr__,local_19);
    }
    this->_error = 4;
    asl::String::operator=(__return_storage_ptr__,"");
  }
  return __return_storage_ptr__;
}

Assistant:

String Socket_::readLine()
{
	char c;
	String s;
	if (available()>0 || waitInput())
	{
		while (1)
		{
			int n = read(&c, 1);
			if (n <= 0 || c == '\n' || _error != 0)
				break;
			if (s.length() > 16000)
			{
				_error = SOCKET_BAD_LINE;
				s = "";
				break;
			}
			s += c;
		}
	}
	return s;
}